

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_circle.cpp
# Opt level: O1

bool __thiscall ON_Circle::Reverse(ON_Circle *this)

{
  ON_3dVector local_28;
  
  ON_3dVector::operator-(&local_28,&(this->plane).yaxis);
  (this->plane).yaxis.z = local_28.z;
  (this->plane).yaxis.x = local_28.x;
  (this->plane).yaxis.y = local_28.y;
  ON_3dVector::operator-(&local_28,&(this->plane).zaxis);
  (this->plane).zaxis.z = local_28.z;
  (this->plane).zaxis.x = local_28.x;
  (this->plane).zaxis.y = local_28.y;
  ON_Plane::UpdateEquation(&this->plane);
  return true;
}

Assistant:

bool ON_Circle::Reverse()
{
  //ON_3dPoint P = m_point[0];
  //m_point[0] = m_point[2];
  //m_point[2] = P;
  plane.yaxis = -plane.yaxis;
  plane.zaxis = -plane.zaxis;
  plane.UpdateEquation();
  return true;
}